

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue
          (sysbvm_context_t *context,sysbvm_functionBytecodeDirectCompiler_t *compiler_,
          sysbvm_tuple_t astNode,sysbvm_tuple_t breakLabel,sysbvm_tuple_t continueLabel)

{
  sysbvm_stackFrameRecord_t local_78;
  undefined8 local_68;
  sysbvm_functionBytecodeDirectCompiler_t **local_60;
  sysbvm_functionBytecodeDirectCompiler_t *local_50;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t sStack_40;
  sysbvm_tuple_t local_38;
  
  local_60 = &local_50;
  local_48 = 0;
  sStack_40 = 0;
  local_38 = 0;
  local_78.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_78.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_78._12_4_ = 0;
  local_68 = 4;
  local_50 = compiler_;
  sysbvm_stackFrame_pushRecord(&local_78);
  local_48 = local_50->breakLabel;
  sStack_40 = local_50->continueLabel;
  local_50->breakLabel = breakLabel;
  local_50->continueLabel = continueLabel;
  local_38 = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context,local_50,astNode);
  local_50->breakLabel = local_48;
  local_50->continueLabel = sStack_40;
  sysbvm_stackFrame_popRecord(&local_78);
  return local_38;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue(sysbvm_context_t *context, sysbvm_functionBytecodeDirectCompiler_t *compiler_, sysbvm_tuple_t astNode, sysbvm_tuple_t breakLabel, sysbvm_tuple_t continueLabel)
{
    struct {
        sysbvm_functionBytecodeDirectCompiler_t *compiler;
        sysbvm_tuple_t oldBreakLabel;
        sysbvm_tuple_t oldContinueLabel;
        sysbvm_tuple_t result;
    } gcFrame = {
        .compiler = compiler_,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.oldBreakLabel = gcFrame.compiler->breakLabel;
    gcFrame.oldContinueLabel = gcFrame.compiler->continueLabel;
    gcFrame.compiler->breakLabel = breakLabel;
    gcFrame.compiler->continueLabel = continueLabel;

    gcFrame.result = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, gcFrame.compiler, astNode);

    gcFrame.compiler->breakLabel = gcFrame.oldBreakLabel;
    gcFrame.compiler->continueLabel = gcFrame.oldContinueLabel;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}